

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool __thiscall
CLI::App::_parse_arg
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,Classifier current_type,bool local_processing_only)

{
  bool bVar1;
  type tVar2;
  Classifier CVar3;
  int iVar4;
  int iVar5;
  reference pvVar6;
  undefined8 uVar7;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var8;
  element_type *peVar9;
  App *pAVar10;
  undefined1 *puVar11;
  pointer pOVar12;
  int *piVar13;
  Option *pOVar14;
  Option *pOVar15;
  ulong uVar16;
  undefined1 in_CL;
  int in_EDX;
  App *in_RSI;
  long in_RDI;
  string res_1;
  string arg;
  size_t remreqpos;
  string current_;
  string res;
  int result_count;
  int collected;
  int tmax;
  int max_num;
  int min_num;
  Option_p *op;
  bool val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> nval;
  string v;
  App *sub;
  size_type dotloc;
  string nvalue;
  string narg_name;
  shared_ptr<CLI::App> *subc;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range2;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  op_ptr;
  string rest;
  string value;
  string arg_name;
  string current;
  value_type *in_stack_fffffffffffff758;
  Option *in_stack_fffffffffffff760;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff768;
  value_type *__x;
  undefined4 in_stack_fffffffffffff770;
  undefined4 uVar17;
  undefined4 in_stack_fffffffffffff774;
  string *in_stack_fffffffffffff780;
  size_t in_stack_fffffffffffff788;
  undefined4 in_stack_fffffffffffff790;
  undefined4 in_stack_fffffffffffff794;
  undefined4 in_stack_fffffffffffff798;
  undefined4 in_stack_fffffffffffff79c;
  string *in_stack_fffffffffffff7a0;
  pointer in_stack_fffffffffffff7a8;
  undefined2 uVar18;
  App *in_stack_fffffffffffff7b0;
  App *in_stack_fffffffffffff7b8;
  undefined4 in_stack_fffffffffffff7c0;
  undefined4 in_stack_fffffffffffff7c4;
  string *in_stack_fffffffffffff7c8;
  undefined2 uVar19;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  in_stack_fffffffffffff7d0;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  in_stack_fffffffffffff7d8;
  Option *pOVar20;
  Classifier in_stack_fffffffffffff7e0;
  undefined2 in_stack_fffffffffffff7e4;
  undefined1 in_stack_fffffffffffff7e6;
  undefined1 uVar21;
  undefined1 in_stack_fffffffffffff7e7;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  in_stack_fffffffffffff7e8;
  Option *in_stack_fffffffffffff800;
  byte local_7e9;
  App *in_stack_fffffffffffff830;
  string *in_stack_fffffffffffff838;
  pointer in_stack_fffffffffffff840;
  pointer in_stack_fffffffffffff848;
  int in_stack_fffffffffffff854;
  undefined4 in_stack_fffffffffffff858;
  int in_stack_fffffffffffff85c;
  undefined1 in_stack_fffffffffffff89f;
  string *in_stack_fffffffffffff8a0;
  App *in_stack_fffffffffffff8a8;
  string *in_stack_fffffffffffff8d8;
  undefined7 in_stack_fffffffffffff8e0;
  undefined1 in_stack_fffffffffffff8e7;
  string local_6a8 [39];
  undefined1 local_681;
  string local_640 [32];
  pointer local_620;
  string local_618 [32];
  string local_5f8 [32];
  string local_5d8 [32];
  pointer local_5b8;
  string local_5b0 [32];
  string local_590 [32];
  string local_570 [22];
  undefined1 in_stack_fffffffffffffaa6;
  undefined1 in_stack_fffffffffffffaa7;
  Option *in_stack_fffffffffffffaa8;
  string local_4f8 [32];
  string local_4d8 [32];
  pointer local_4b8;
  string local_4b0 [32];
  pointer local_490;
  string local_488 [32];
  pointer local_468;
  string local_460 [32];
  string local_440 [32];
  string local_420 [36];
  int local_3fc;
  int local_3f8;
  int local_3f4;
  int local_3f0;
  int local_3ec;
  int local_3e8;
  int local_3e4;
  string local_3e0 [32];
  reference local_3c0;
  undefined1 local_3b1;
  string local_3b0 [32];
  string local_390 [32];
  App *in_stack_fffffffffffffc90;
  allocator local_349;
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  App *local_2a8;
  long local_2a0;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_298;
  string local_290 [32];
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_270;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_268;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_260;
  allocator<char> local_252;
  undefined1 local_251;
  undefined1 *local_250;
  undefined8 local_248;
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [36];
  int local_1bc;
  reference local_1b8;
  shared_ptr<CLI::App> *local_1b0;
  __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
  local_1a8;
  long local_1a0;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_198;
  string local_190 [40];
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_168;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_160;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_158;
  undefined1 local_14a;
  allocator local_149;
  string local_148 [38];
  undefined1 local_122;
  allocator local_121;
  string local_120 [38];
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [39];
  undefined1 local_d1;
  value_type local_a0;
  string local_80 [32];
  string local_60 [32];
  string local_40 [27];
  undefined1 in_stack_ffffffffffffffdb;
  Classifier in_stack_ffffffffffffffdc;
  undefined3 in_stack_ffffffffffffffe0;
  uint uVar22;
  byte local_1;
  
  uVar22 = CONCAT13(in_CL,in_stack_ffffffffffffffe0) & 0x1ffffff;
  pvVar6 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff760);
  ::std::__cxx11::string::string(local_40,(string *)pvVar6);
  ::std::__cxx11::string::string(local_60);
  ::std::__cxx11::string::string(local_80);
  ::std::__cxx11::string::string((string *)&local_a0);
  switch(in_EDX) {
  case 0:
  case 1:
  case 5:
  case 6:
  default:
    local_14a = 1;
    uVar7 = __cxa_allocate_exception(0x38);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_148,"parsing got called with invalid option! You should not see this",
               &local_149);
    HorribleError::HorribleError
              ((HorribleError *)in_stack_fffffffffffff7d0._M_current,in_stack_fffffffffffff7c8);
    local_14a = 0;
    __cxa_throw(uVar7,&HorribleError::typeinfo,HorribleError::~HorribleError);
  case 2:
    bVar1 = detail::split_short((string *)in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                                (string *)
                                CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
    if (!bVar1) {
      local_fa = 1;
      uVar7 = __cxa_allocate_exception(0x38);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_f8,"Short parsed but missing! You should not see this",&local_f9);
      HorribleError::HorribleError
                ((HorribleError *)in_stack_fffffffffffff7d0._M_current,in_stack_fffffffffffff7c8);
      local_fa = 0;
      __cxa_throw(uVar7,&HorribleError::typeinfo,HorribleError::~HorribleError);
    }
    break;
  case 3:
    bVar1 = detail::split_long(in_stack_fffffffffffff7c8,
                               (string *)
                               CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                               (string *)in_stack_fffffffffffff7b8);
    if (!bVar1) {
      local_d1 = 1;
      uVar7 = __cxa_allocate_exception(0x38);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff760);
      ::std::operator+((char *)in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0);
      HorribleError::HorribleError
                ((HorribleError *)in_stack_fffffffffffff7d0._M_current,in_stack_fffffffffffff7c8);
      local_d1 = 0;
      __cxa_throw(uVar7,&HorribleError::typeinfo,HorribleError::~HorribleError);
    }
    break;
  case 4:
    bVar1 = detail::split_windows_style
                      (in_stack_fffffffffffff7c8,
                       (string *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                       (string *)in_stack_fffffffffffff7b8);
    if (!bVar1) {
      local_122 = 1;
      uVar7 = __cxa_allocate_exception(0x38);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_120,"windows option parsed but missing! You should not see this",&local_121);
      HorribleError::HorribleError
                ((HorribleError *)in_stack_fffffffffffff7d0._M_current,in_stack_fffffffffffff7c8);
      local_122 = 0;
      __cxa_throw(uVar7,&HorribleError::typeinfo,HorribleError::~HorribleError);
    }
  }
  local_160 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
              ::std::
              begin<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                        ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                          *)in_stack_fffffffffffff758);
  local_168 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
              ::std::
              end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                        ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                          *)in_stack_fffffffffffff758);
  ::std::__cxx11::string::string(local_190,local_60);
  _Var8._M_current._4_2_ = in_stack_fffffffffffff7e4;
  _Var8._M_current._0_4_ = in_stack_fffffffffffff7e0;
  _Var8._M_current._6_1_ = in_stack_fffffffffffff7e6;
  _Var8._M_current._7_1_ = in_stack_fffffffffffff7e7;
  _Var8 = ::std::
          find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                    (in_stack_fffffffffffff7e8,_Var8,
                     (anon_class_40_2_a297e68f_for__M_pred *)in_stack_fffffffffffff7d8._M_current);
  local_158 = _Var8;
  _parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)
  ::{lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)#1}::~unique_ptr
            ((anon_class_40_2_a297e68f_for__M_pred *)0x16aa1d);
  local_198 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
              ::std::
              end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                        ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                          *)in_stack_fffffffffffff758);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                      *)in_stack_fffffffffffff760,
                     (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                      *)in_stack_fffffffffffff758);
  if (bVar1) {
    local_1a0 = in_RDI + 0x2c0;
    local_1a8._M_current =
         (shared_ptr<CLI::App> *)
         std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::begin
                   ((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                     *)in_stack_fffffffffffff758);
    local_1b0 = (shared_ptr<CLI::App> *)
                std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                ::end((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                       *)in_stack_fffffffffffff758);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                               *)in_stack_fffffffffffff760,
                              (__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                               *)in_stack_fffffffffffff758), bVar1) {
      local_1b8 = __gnu_cxx::
                  __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                  ::operator*(&local_1a8);
      std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x16aad7
                );
      uVar16 = ::std::__cxx11::string::empty();
      if (((uVar16 & 1) != 0) &&
         (peVar9 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x16aaf9), (peVar9->disabled_ & 1U) == 0)) {
        std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x16ab10);
        in_stack_fffffffffffff8e7 =
             _parse_arg(in_RSI,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)CONCAT44(in_EDX,uVar22),in_stack_ffffffffffffffdc,
                        (bool)in_stack_ffffffffffffffdb);
        if ((bool)in_stack_fffffffffffff8e7) {
          peVar9 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x16ab58);
          if ((peVar9->pre_parse_called_ & 1U) == 0) {
            std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x16ab6b);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RSI);
            _trigger_pre_parse((App *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                               in_stack_fffffffffffff788);
          }
          local_1 = 1;
          local_1bc = 1;
          goto LAB_0016c6cd;
        }
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
      ::operator++(&local_1a8);
    }
    if ((((*(byte *)(in_RDI + 0x2e3) & 1) != 0) && (in_EDX == 2)) &&
       (uVar16 = ::std::__cxx11::string::size(), 2 < uVar16)) {
      ::std::__cxx11::string::string(local_1e0);
      ::std::__cxx11::string::string(local_200);
      local_251 = 0x2d;
      local_250 = &local_251;
      local_248 = 1;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_240,local_250,local_248,&local_252);
      ::std::operator+(in_stack_fffffffffffff768,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff760);
      detail::split_long(in_stack_fffffffffffff7c8,
                         (string *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                         (string *)in_stack_fffffffffffff7b8);
      ::std::__cxx11::string::~string(local_220);
      ::std::__cxx11::string::~string(local_240);
      ::std::allocator<char>::~allocator(&local_252);
      local_268 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                  ::std::
                  begin<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                            ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                              *)in_stack_fffffffffffff758);
      local_270 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                  ::std::
                  end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                            ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                              *)in_stack_fffffffffffff758);
      ::std::__cxx11::string::string(local_290,local_1e0);
      local_260 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                  ::std::
                  find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_2_>
                            (in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,
                             (anon_class_32_1_6b09f7e2_for__M_pred *)in_stack_fffffffffffff7c8);
      local_158 = (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                   )local_260;
      _parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)
      ::{lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)#2}::~unique_ptr
                ((anon_class_32_1_6b09f7e2_for__M_pred *)0x16ada5);
      local_298 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                  ::std::
                  end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                            ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                              *)in_stack_fffffffffffff758);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                          *)in_stack_fffffffffffff760,
                         (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                          *)in_stack_fffffffffffff758);
      if (bVar1) {
        ::std::__cxx11::string::operator=(local_60,local_1e0);
        ::std::__cxx11::string::operator=(local_80,local_200);
        ::std::__cxx11::string::clear();
        local_1bc = 4;
      }
      else {
        local_1bc = 0;
      }
      ::std::__cxx11::string::~string(local_200);
      ::std::__cxx11::string::~string(local_1e0);
      if (local_1bc != 0) goto LAB_0016b5d1;
    }
    uVar19 = (undefined2)((ulong)in_stack_fffffffffffff7c8 >> 0x30);
    uVar18 = (undefined2)((ulong)in_stack_fffffffffffff7a8 >> 0x30);
    if ((*(long *)(in_RDI + 0x308) == 0) ||
       (uVar16 = ::std::__cxx11::string::empty(), (uVar16 & 1) == 0)) {
      local_2a0 = ::std::__cxx11::string::find_first_of((char)local_60,0x2e);
      if (local_2a0 != -1) {
        ::std::__cxx11::string::substr((ulong)local_2c8,(ulong)local_60);
        pAVar10 = _find_subcommand(in_stack_fffffffffffff7b8,(string *)in_stack_fffffffffffff7b0,
                                   SUB21((ushort)uVar18 >> 8,0),SUB21(uVar18,0));
        ::std::__cxx11::string::~string(local_2c8);
        local_2a8 = pAVar10;
        if (pAVar10 != (App *)0x0) {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff760);
          ::std::__cxx11::string::string(local_2e8,(string *)pvVar6);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x16b032);
          ::std::__cxx11::string::substr((ulong)local_308,(ulong)local_60);
          ::std::__cxx11::string::operator=(local_60,local_308);
          ::std::__cxx11::string::~string(local_308);
          uVar16 = ::std::__cxx11::string::size();
          if (uVar16 < 2) {
            ::std::__cxx11::string::substr((ulong)local_390,(ulong)local_2e8);
            puVar11 = (undefined1 *)::std::__cxx11::string::front();
            *puVar11 = 0x2d;
            uVar16 = ::std::__cxx11::string::size();
            if (2 < uVar16) {
              ::std::__cxx11::string::substr((ulong)local_3b0,(ulong)local_390);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff760,in_stack_fffffffffffff758);
              ::std::__cxx11::string::~string(local_3b0);
              ::std::__cxx11::string::resize((ulong)local_390);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                        in_stack_fffffffffffff768);
            in_EDX = 2;
            ::std::__cxx11::string::~string(local_390);
          }
          else {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_348,"--",&local_349);
            ::std::__cxx11::string::substr((ulong)&stack0xfffffffffffffc90,(ulong)local_2e8);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff760,in_stack_fffffffffffff758);
            ::std::__cxx11::string::~string(local_328);
            ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffc90);
            ::std::__cxx11::string::~string(local_348);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_349);
            in_EDX = 3;
          }
          local_3b1 = _parse_arg(in_RSI,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)CONCAT44(in_EDX,uVar22),in_stack_ffffffffffffffdc,
                                 (bool)in_stack_ffffffffffffffdb);
          if ((bool)local_3b1) {
            if ((local_2a8->silent_ & 1U) == 0) {
              std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::push_back
                        ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)
                         CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                         (value_type *)in_stack_fffffffffffff768);
            }
            increment_parsed((App *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RSI);
            _trigger_pre_parse((App *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                               in_stack_fffffffffffff788);
            bVar1 = ::std::function::operator_cast_to_bool((function<void_()> *)0x16b415);
            if (bVar1) {
              _process_env(in_stack_fffffffffffff830);
              _process_callbacks((App *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0
                                                ));
              _process_help_flags(in_stack_fffffffffffff7b0,SUB21((ushort)uVar18 >> 8,0),
                                  SUB21(uVar18,0));
              _process_requirements(in_stack_fffffffffffffc90);
              run_callback((App *)in_stack_fffffffffffff7d0._M_current,SUB21((ushort)uVar19 >> 8,0),
                           SUB21(uVar19,0));
            }
            local_1 = 1;
            local_1bc = 1;
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x16b495);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                        in_stack_fffffffffffff768);
            local_1bc = 0;
          }
          ::std::__cxx11::string::~string(local_2e8);
          if (local_1bc != 0) goto LAB_0016c6cd;
        }
      }
      CVar3 = (Classifier)(in_stack_fffffffffffff788 >> 0x20);
      if ((uVar22 & 0x1000000) == 0) {
        if ((*(long *)(in_RDI + 0x308) == 0) || ((*(byte *)(in_RDI + 0x2da) & 1) == 0)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x16b59b);
          _move_to_missing((App *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                           CVar3,in_stack_fffffffffffff780);
          local_1 = 1;
          local_1bc = 1;
        }
        else {
          _get_fallthrough_parent(in_stack_fffffffffffff7b0);
          local_1 = _parse_arg(in_RSI,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)CONCAT44(in_EDX,uVar22),in_stack_ffffffffffffffdc,
                               (bool)in_stack_ffffffffffffffdb);
          local_1bc = 1;
        }
      }
      else {
        local_1 = 0;
        local_1bc = 1;
      }
    }
    else {
      local_1 = 0;
      local_1bc = 1;
    }
    goto LAB_0016c6cd;
  }
LAB_0016b5d1:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x16b5de);
  local_3c0 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
              ::operator*(&local_158);
  pOVar12 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                      ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16b600);
  bVar1 = Option::get_inject_separator(pOVar12);
  if (bVar1) {
    pOVar12 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                        ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16b62e);
    Option::results_abi_cxx11_(pOVar12);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
    if (!bVar1) {
      pOVar12 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16b653);
      Option::results_abi_cxx11_(pOVar12);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff760);
      uVar16 = ::std::__cxx11::string::empty();
      if ((uVar16 & 1) == 0) {
        std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                  ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16b67c);
        ::std::__cxx11::string::string(local_3e0);
        Option::add_result(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
        ::std::__cxx11::string::~string(local_3e0);
      }
    }
  }
  pOVar12 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                      ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16b6f4);
  bVar1 = Option::get_trigger_on_parse(pOVar12);
  if ((bVar1) &&
     (pOVar12 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16b71f),
     pOVar12->current_option_state_ == callback_run)) {
    std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16b735);
    Option::clear(in_stack_fffffffffffff760);
  }
  pOVar12 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                      ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16b74a);
  local_3e8 = Option::get_type_size_min(pOVar12);
  pOVar12 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                      ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16b776);
  local_3ec = Option::get_items_expected_min(pOVar12);
  piVar13 = std::min<int>(&local_3e8,&local_3ec);
  local_3e4 = *piVar13;
  std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
            ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16b7c2);
  local_3f0 = Option::get_items_expected_max(in_stack_fffffffffffff760);
  if (0x1ffffff < local_3f0) {
    pOVar12 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                        ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16b7ff);
    bVar1 = Option::get_allow_extra_args(pOVar12);
    if (!bVar1) {
      pOVar12 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16b82e);
      in_stack_fffffffffffff85c = Option::get_type_size_max(pOVar12);
      local_3f4 = in_stack_fffffffffffff85c;
      pOVar12 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16b85a);
      Option::get_expected_min(pOVar12);
      tVar2 = detail::checked_multiply<int>
                        ((int *)in_stack_fffffffffffff768,
                         (int)((ulong)in_stack_fffffffffffff760 >> 0x20));
      in_stack_fffffffffffff858 = CONCAT13(tVar2,(int3)in_stack_fffffffffffff858);
      in_stack_fffffffffffff854 = local_3f4;
      local_3f0 = local_3f4;
      if (!tVar2) {
        local_3f0 = 0x20000000;
        in_stack_fffffffffffff854 = local_3f0;
      }
    }
  }
  local_3f8 = 0;
  local_3fc = 0;
  if (local_3f0 == 0) {
    in_stack_fffffffffffff848 =
         std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                   ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16b8e4);
    ::std::__cxx11::string::string(local_440,local_80);
    Option::get_flag_value
              ((Option *)_Var8._M_current,
               (string *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
               in_stack_fffffffffffff8d8);
    ::std::__cxx11::string::~string(local_440);
    in_stack_fffffffffffff840 =
         std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                   ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16b944);
    ::std::__cxx11::string::string(local_460,local_420);
    Option::add_result(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    ::std::__cxx11::string::~string(local_460);
    in_stack_fffffffffffff838 = (string *)(in_RDI + 0x1d0);
    local_468 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
                          ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                           in_stack_fffffffffffff760);
    std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
              ((vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *)in_stack_fffffffffffff760,
               (value_type *)in_stack_fffffffffffff758);
    ::std::__cxx11::string::~string(local_420);
  }
  else {
    uVar16 = ::std::__cxx11::string::empty();
    if ((uVar16 & 1) == 0) {
      std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16ba6c);
      ::std::__cxx11::string::string(local_488,local_80);
      Option::add_result((Option *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                         in_stack_fffffffffffff768,(int *)in_stack_fffffffffffff760);
      ::std::__cxx11::string::~string(local_488);
      local_490 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
                            ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                             in_stack_fffffffffffff760);
      std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                ((vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *)in_stack_fffffffffffff760,
                 (value_type *)in_stack_fffffffffffff758);
      local_3f8 = local_3fc + local_3f8;
    }
    else {
      uVar16 = ::std::__cxx11::string::empty();
      if ((uVar16 & 1) == 0) {
        std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                  ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16bb5b);
        ::std::__cxx11::string::string(local_4b0,(string *)&local_a0);
        Option::add_result((Option *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                           in_stack_fffffffffffff768,(int *)in_stack_fffffffffffff760);
        ::std::__cxx11::string::~string(local_4b0);
        local_4b8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
                              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                               in_stack_fffffffffffff760);
        std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                  ((vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *)
                   in_stack_fffffffffffff760,(value_type *)in_stack_fffffffffffff758);
        ::std::__cxx11::string::operator=((string *)&local_a0,"");
        local_3f8 = local_3fc + local_3f8;
      }
    }
  }
  while( true ) {
    local_7e9 = 0;
    if (local_3f8 < local_3e4) {
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
      local_7e9 = bVar1 ^ 0xff;
    }
    iVar5 = (int)((ulong)in_stack_fffffffffffff840 >> 0x20);
    uVar21 = (undefined1)(in_stack_fffffffffffff788 >> 0x38);
    if ((local_7e9 & 1) == 0) break;
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff760);
    ::std::__cxx11::string::string(local_4d8,(string *)pvVar6);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x16bcac);
    std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16bcb9);
    ::std::__cxx11::string::string(local_4f8,local_4d8);
    Option::add_result((Option *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                       in_stack_fffffffffffff768,(int *)in_stack_fffffffffffff760);
    ::std::__cxx11::string::~string(local_4f8);
    in_stack_fffffffffffff800 = (Option *)(in_RDI + 0x1d0);
    std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
               in_stack_fffffffffffff760);
    std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
              ((vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *)in_stack_fffffffffffff760,
               (value_type *)in_stack_fffffffffffff758);
    local_3f8 = local_3fc + local_3f8;
    ::std::__cxx11::string::~string(local_4d8);
  }
  if (local_3f8 < local_3e4) {
    uVar7 = __cxa_allocate_exception(0x38);
    std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16bdf1);
    Option::get_name_abi_cxx11_
              (in_stack_fffffffffffffaa8,(bool)in_stack_fffffffffffffaa7,
               (bool)in_stack_fffffffffffffaa6);
    std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16be22);
    Option::get_type_name_abi_cxx11_((Option *)in_stack_fffffffffffff7e8._M_current);
    ArgumentMismatch::TypedAtLeast
              ((string *)in_stack_fffffffffffff848,iVar5,in_stack_fffffffffffff838);
    __cxa_throw(uVar7,&ArgumentMismatch::typeinfo,ArgumentMismatch::~ArgumentMismatch);
  }
  if (local_3f8 < local_3f0) {
LAB_0016bf38:
    pOVar14 = (Option *)
              _count_remaining_positionals
                        ((App *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                         (bool)uVar21);
    in_stack_fffffffffffff7e8._M_current =
         (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)pOVar14;
    do {
      if (local_3f8 < local_3f0) {
LAB_0016bfa9:
        bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
        uVar21 = false;
        if (!bVar1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff760);
          in_stack_fffffffffffff7e0 =
               _recognize(in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
                          (bool)in_stack_fffffffffffff89f);
          uVar21 = in_stack_fffffffffffff7e0 == NONE;
        }
      }
      else {
        pOVar12 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                            ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16bf81)
        ;
        in_stack_fffffffffffff7e7 = Option::get_allow_extra_args(pOVar12);
        uVar21 = false;
        if ((bool)in_stack_fffffffffffff7e7) goto LAB_0016bfa9;
      }
      if (((bool)uVar21 == false) ||
         (pOVar20 = pOVar14,
         pOVar15 = (Option *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_RSI), pOVar15 <= pOVar20)) goto LAB_0016c216;
      if ((*(byte *)(in_RDI + 0x2e1) & 1) != 0) {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff760);
        iVar5 = (int)((ulong)pOVar20 >> 0x20);
        ::std::__cxx11::string::string(local_570,(string *)pvVar6);
        std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                  ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16c085);
        Option::_validate((Option *)in_stack_fffffffffffff7e8._M_current,
                          (string *)
                          CONCAT17(in_stack_fffffffffffff7e7,
                                   CONCAT16(uVar21,CONCAT24(in_stack_fffffffffffff7e4,
                                                            in_stack_fffffffffffff7e0))),iVar5);
        ::std::__cxx11::string::operator=(local_570,local_590);
        ::std::__cxx11::string::~string(local_590);
        uVar16 = ::std::__cxx11::string::empty();
        if ((uVar16 & 1) == 0) {
          local_1bc = 10;
        }
        else {
          local_1bc = 0;
        }
        ::std::__cxx11::string::~string(local_570);
        if (local_1bc != 0) goto LAB_0016c216;
      }
      std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16c140);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff760);
      ::std::__cxx11::string::string(local_5b0,(string *)pvVar6);
      Option::add_result((Option *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                         in_stack_fffffffffffff768,(int *)in_stack_fffffffffffff760);
      ::std::__cxx11::string::~string(local_5b0);
      local_5b8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
                            ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                             in_stack_fffffffffffff760);
      std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                ((vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *)in_stack_fffffffffffff760,
                 (value_type *)in_stack_fffffffffffff758);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x16c1d6);
      local_3f8 = local_3fc + local_3f8;
    } while( true );
  }
  pOVar12 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                      ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16bf17);
  bVar1 = Option::get_allow_extra_args(pOVar12);
  if (bVar1) goto LAB_0016bf38;
LAB_0016c3e7:
  if (0 < local_3e4) {
    iVar5 = local_3f8;
    pOVar12 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                        ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16c40d);
    iVar4 = Option::get_type_size_max(pOVar12);
    if (iVar5 % iVar4 != 0) {
      pOVar12 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16c43c);
      iVar5 = Option::get_type_size_max(pOVar12);
      pOVar12 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16c457);
      iVar4 = Option::get_type_size_min(pOVar12);
      if (iVar5 == iVar4) {
        local_681 = 1;
        uVar7 = __cxa_allocate_exception(0x38);
        std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                  ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16c502);
        Option::get_name_abi_cxx11_
                  (in_stack_fffffffffffffaa8,(bool)in_stack_fffffffffffffaa7,
                   (bool)in_stack_fffffffffffffaa6);
        pOVar12 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                            ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16c525)
        ;
        Option::get_type_size_min(pOVar12);
        std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                  ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16c540);
        Option::get_type_name_abi_cxx11_((Option *)in_stack_fffffffffffff7e8._M_current);
        ArgumentMismatch::PartialType
                  ((string *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                   in_stack_fffffffffffff854,(string *)in_stack_fffffffffffff848);
        local_681 = 0;
        __cxa_throw(uVar7,&ArgumentMismatch::typeinfo,ArgumentMismatch::~ArgumentMismatch);
      }
      std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16c47e);
      ::std::__cxx11::string::string(local_640);
      Option::add_result(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
      ::std::__cxx11::string::~string(local_640);
    }
  }
  pOVar12 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                      ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16c61b);
  bVar1 = Option::get_trigger_on_parse(pOVar12);
  uVar17 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff770);
  if (bVar1) {
    std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16c640);
    Option::run_callback(in_stack_fffffffffffff800);
  }
  uVar16 = ::std::__cxx11::string::empty();
  if ((uVar16 & 1) == 0) {
    ::std::operator+((char *)in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0);
    __x = &local_a0;
    this_00 = local_6a8;
    ::std::__cxx11::string::operator=((string *)__x,this_00);
    ::std::__cxx11::string::~string(this_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffff774,uVar17),__x);
  }
  local_1 = 1;
  local_1bc = 1;
LAB_0016c6cd:
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string(local_80);
  ::std::__cxx11::string::~string(local_60);
  ::std::__cxx11::string::~string(local_40);
  return (bool)(local_1 & 1);
LAB_0016c216:
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
  if (!bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff760);
    CVar3 = _recognize(in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
                       (bool)in_stack_fffffffffffff89f);
    if (CVar3 == POSITIONAL_MARK) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x16c265);
    }
  }
  if (((local_3e4 == 0) && (0 < local_3f0)) && (local_3f8 == 0)) {
    std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16c29c);
    ::std::__cxx11::string::string(local_5f8);
    Option::get_flag_value
              ((Option *)_Var8._M_current,
               (string *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
               in_stack_fffffffffffff8d8);
    ::std::__cxx11::string::~string(local_5f8);
    in_stack_fffffffffffff7a8 =
         std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                   ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x16c2ee);
    ::std::__cxx11::string::string(local_618,local_5d8);
    Option::add_result(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    ::std::__cxx11::string::~string(local_618);
    in_stack_fffffffffffff7a0 = (string *)(in_RDI + 0x1d0);
    local_620 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
                          ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                           in_stack_fffffffffffff760);
    std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
              ((vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *)in_stack_fffffffffffff760,
               (value_type *)in_stack_fffffffffffff758);
    ::std::__cxx11::string::~string(local_5d8);
  }
  goto LAB_0016c3e7;
}

Assistant:

CLI11_INLINE bool
App::_parse_arg(std::vector<std::string> &args, detail::Classifier current_type, bool local_processing_only) {

    std::string current = args.back();

    std::string arg_name;
    std::string value;
    std::string rest;

    switch(current_type) {
    case detail::Classifier::LONG:
        if(!detail::split_long(current, arg_name, value))
            throw HorribleError("Long parsed but missing (you should not see this):" + args.back());
        break;
    case detail::Classifier::SHORT:
        if(!detail::split_short(current, arg_name, rest))
            throw HorribleError("Short parsed but missing! You should not see this");
        break;
    case detail::Classifier::WINDOWS_STYLE:
        if(!detail::split_windows_style(current, arg_name, value))
            throw HorribleError("windows option parsed but missing! You should not see this");
        break;
    case detail::Classifier::SUBCOMMAND:
    case detail::Classifier::SUBCOMMAND_TERMINATOR:
    case detail::Classifier::POSITIONAL_MARK:
    case detail::Classifier::NONE:
    default:
        throw HorribleError("parsing got called with invalid option! You should not see this");
    }

    auto op_ptr = std::find_if(std::begin(options_), std::end(options_), [arg_name, current_type](const Option_p &opt) {
        if(current_type == detail::Classifier::LONG)
            return opt->check_lname(arg_name);
        if(current_type == detail::Classifier::SHORT)
            return opt->check_sname(arg_name);
        // this will only get called for detail::Classifier::WINDOWS_STYLE
        return opt->check_lname(arg_name) || opt->check_sname(arg_name);
    });

    // Option not found
    while(op_ptr == std::end(options_)) {
        // using while so we can break
        for(auto &subc : subcommands_) {
            if(subc->name_.empty() && !subc->disabled_) {
                if(subc->_parse_arg(args, current_type, local_processing_only)) {
                    if(!subc->pre_parse_called_) {
                        subc->_trigger_pre_parse(args.size());
                    }
                    return true;
                }
            }
        }
        if(allow_non_standard_options_ && current_type == detail::Classifier::SHORT && current.size() > 2) {
            std::string narg_name;
            std::string nvalue;
            detail::split_long(std::string{'-'} + current, narg_name, nvalue);
            op_ptr = std::find_if(std::begin(options_), std::end(options_), [narg_name](const Option_p &opt) {
                return opt->check_sname(narg_name);
            });
            if(op_ptr != std::end(options_)) {
                arg_name = narg_name;
                value = nvalue;
                rest.clear();
                break;
            }
        }

        // don't capture missing if this is a nameless subcommand and nameless subcommands can't fallthrough
        if(parent_ != nullptr && name_.empty()) {
            return false;
        }

        // now check for '.' notation of subcommands
        auto dotloc = arg_name.find_first_of('.', 1);
        if(dotloc != std::string::npos) {
            // using dot notation is equivalent to single argument subcommand
            auto *sub = _find_subcommand(arg_name.substr(0, dotloc), true, false);
            if(sub != nullptr) {
                std::string v = args.back();
                args.pop_back();
                arg_name = arg_name.substr(dotloc + 1);
                if(arg_name.size() > 1) {
                    args.push_back(std::string("--") + v.substr(dotloc + 3));
                    current_type = detail::Classifier::LONG;
                } else {
                    auto nval = v.substr(dotloc + 2);
                    nval.front() = '-';
                    if(nval.size() > 2) {
                        // '=' not allowed in short form arguments
                        args.push_back(nval.substr(3));
                        nval.resize(2);
                    }
                    args.push_back(nval);
                    current_type = detail::Classifier::SHORT;
                }
                auto val = sub->_parse_arg(args, current_type, true);
                if(val) {
                    if(!sub->silent_) {
                        parsed_subcommands_.push_back(sub);
                    }
                    // deal with preparsing
                    increment_parsed();
                    _trigger_pre_parse(args.size());
                    // run the parse complete callback since the subcommand processing is now complete
                    if(sub->parse_complete_callback_) {
                        sub->_process_env();
                        sub->_process_callbacks();
                        sub->_process_help_flags();
                        sub->_process_requirements();
                        sub->run_callback(false, true);
                    }
                    return true;
                }
                args.pop_back();
                args.push_back(v);
            }
        }
        if(local_processing_only) {
            return false;
        }
        // If a subcommand, try the main command
        if(parent_ != nullptr && fallthrough_)
            return _get_fallthrough_parent()->_parse_arg(args, current_type, false);

        // Otherwise, add to missing
        args.pop_back();
        _move_to_missing(current_type, current);
        return true;
    }

    args.pop_back();

    // Get a reference to the pointer to make syntax bearable
    Option_p &op = *op_ptr;
    /// if we require a separator add it here
    if(op->get_inject_separator()) {
        if(!op->results().empty() && !op->results().back().empty()) {
            op->add_result(std::string{});
        }
    }
    if(op->get_trigger_on_parse() && op->current_option_state_ == Option::option_state::callback_run) {
        op->clear();
    }
    int min_num = (std::min)(op->get_type_size_min(), op->get_items_expected_min());
    int max_num = op->get_items_expected_max();
    // check container like options to limit the argument size to a single type if the allow_extra_flags argument is
    // set. 16 is somewhat arbitrary (needs to be at least 4)
    if(max_num >= detail::expected_max_vector_size / 16 && !op->get_allow_extra_args()) {
        auto tmax = op->get_type_size_max();
        max_num = detail::checked_multiply(tmax, op->get_expected_min()) ? tmax : detail::expected_max_vector_size;
    }
    // Make sure we always eat the minimum for unlimited vectors
    int collected = 0;     // total number of arguments collected
    int result_count = 0;  // local variable for number of results in a single arg string
    // deal with purely flag like things
    if(max_num == 0) {
        auto res = op->get_flag_value(arg_name, value);
        op->add_result(res);
        parse_order_.push_back(op.get());
    } else if(!value.empty()) {  // --this=value
        op->add_result(value, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
        // -Trest
    } else if(!rest.empty()) {
        op->add_result(rest, result_count);
        parse_order_.push_back(op.get());
        rest = "";
        collected += result_count;
    }

    // gather the minimum number of arguments
    while(min_num > collected && !args.empty()) {
        std::string current_ = args.back();
        args.pop_back();
        op->add_result(current_, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
    }

    if(min_num > collected) {  // if we have run out of arguments and the minimum was not met
        throw ArgumentMismatch::TypedAtLeast(op->get_name(), min_num, op->get_type_name());
    }

    // now check for optional arguments
    if(max_num > collected || op->get_allow_extra_args()) {  // we allow optional arguments
        auto remreqpos = _count_remaining_positionals(true);
        // we have met the minimum now optionally check up to the maximum
        while((collected < max_num || op->get_allow_extra_args()) && !args.empty() &&
              _recognize(args.back(), false) == detail::Classifier::NONE) {
            // If any required positionals remain, don't keep eating
            if(remreqpos >= args.size()) {
                break;
            }
            if(validate_optional_arguments_) {
                std::string arg = args.back();
                arg = op->_validate(arg, 0);
                if(!arg.empty()) {
                    break;
                }
            }
            op->add_result(args.back(), result_count);
            parse_order_.push_back(op.get());
            args.pop_back();
            collected += result_count;
        }

        // Allow -- to end an unlimited list and "eat" it
        if(!args.empty() && _recognize(args.back()) == detail::Classifier::POSITIONAL_MARK)
            args.pop_back();
        // optional flag that didn't receive anything now get the default value
        if(min_num == 0 && max_num > 0 && collected == 0) {
            auto res = op->get_flag_value(arg_name, std::string{});
            op->add_result(res);
            parse_order_.push_back(op.get());
        }
    }
    // if we only partially completed a type then add an empty string if allowed for later processing
    if(min_num > 0 && (collected % op->get_type_size_max()) != 0) {
        if(op->get_type_size_max() != op->get_type_size_min()) {
            op->add_result(std::string{});
        } else {
            throw ArgumentMismatch::PartialType(op->get_name(), op->get_type_size_min(), op->get_type_name());
        }
    }
    if(op->get_trigger_on_parse()) {
        op->run_callback();
    }
    if(!rest.empty()) {
        rest = "-" + rest;
        args.push_back(rest);
    }
    return true;
}